

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignalsImpl::ValidationSignalsImpl
          (ValidationSignalsImpl *this,
          unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
          task_runner)

{
  long lVar1;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> *puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_list).
  super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_list;
  (this->m_list).
  super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_list;
  (this->m_list).
  super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_map)._M_h._M_buckets = &(this->m_map)._M_h._M_single_bucket;
  (this->m_map)._M_h._M_bucket_count = 1;
  (this->m_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_map)._M_h._M_element_count = 0;
  (this->m_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar2 = inline_assertion_check<true,std::unique_ptr<util::TaskRunnerInterface,std::default_delete<util::TaskRunnerInterface>>&>
                     ((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)task_runner._M_t.
                         super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                         .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
                      ,0x30,"ValidationSignalsImpl","task_runner");
  (this->m_task_runner)._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (puVar2->_M_t).
       super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
       ._M_t.
       super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
       .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl;
  (puVar2->_M_t).
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (TaskRunnerInterface *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit ValidationSignalsImpl(std::unique_ptr<util::TaskRunnerInterface> task_runner)
        : m_task_runner{std::move(Assert(task_runner))} {}